

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtils.cpp
# Opt level: O0

void ApprovalTests::FileUtils::writeToFile(string *filePath,string *content)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  runtime_error *this;
  string *in_RSI;
  ofstream out;
  string local_240 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  
  pcVar3 = (char *)::std::__cxx11::string::c_str();
  _Var2 = ::std::operator|(_S_bin,_S_out);
  ::std::ofstream::ofstream(&stack0xfffffffffffffdf0,pcVar3,_Var2);
  bVar1 = ::std::ios::operator!
                    ((ios *)(&stack0xfffffffffffffdf0 +
                            in_stack_fffffffffffffdf0[-1]._M_string_length));
  if ((bVar1 & 1) == 0) {
    ::std::operator<<((ostream *)&stack0xfffffffffffffdf0,in_RSI);
    ::std::ofstream::~ofstream(&stack0xfffffffffffffdf0);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  ::std::runtime_error::runtime_error(this,local_240);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void FileUtils::writeToFile(const std::string& filePath, const std::string& content)
    {
        std::ofstream out(filePath.c_str(), std::ios::binary | std::ofstream::out);
        if (!out)
        {
            throw std::runtime_error("Unable to write file: " + filePath);
        }
        out << content;
    }